

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

int scratch_attr_too_big(_internal_exr_seq_scratch *scr,int32_t attrsz)

{
  long lVar1;
  int64_t foff;
  int64_t test;
  int64_t acmp;
  int32_t attrsz_local;
  _internal_exr_seq_scratch *scr_local;
  
  lVar1 = (long)attrsz;
  if ((scr->ctxt->file_size < 1) || (lVar1 <= scr->navail)) {
    if ((scr->navail < lVar1) && (0x7ffffffe < lVar1)) {
      return 1;
    }
  }
  else if (scr->ctxt->file_size < (long)(scr->fileoff + (lVar1 - scr->navail))) {
    return 1;
  }
  return 0;
}

Assistant:

static inline int
scratch_attr_too_big (struct _internal_exr_seq_scratch* scr, int32_t attrsz)
{
    int64_t acmp = (int64_t) attrsz;
    if (scr->ctxt->file_size > 0 && (acmp > scr->navail))
    {
        int64_t test = acmp - scr->navail;
        int64_t foff = (int64_t) scr->fileoff;
        if ((foff + test) > scr->ctxt->file_size) return 1;
    }
    else if (acmp > scr->navail && acmp >= INT32_MAX)
        return 1;

    return 0;
}